

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::quadratic_cost_type
          (quadratic_cost_type<double> *this,quadratic_cost_type<double> *other,int n)

{
  double *__s;
  long lVar1;
  quad *__s_00;
  int *__s_01;
  long lVar2;
  int __n2;
  int *__src;
  ulong uVar3;
  
  lVar2 = (long)n;
  uVar3 = lVar2 * 8;
  if (n < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  this->obj = other->obj;
  __s = (double *)operator_new__(uVar3);
  memset(__s,0,uVar3);
  (this->linear_elements)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = __s;
  lVar1 = (long)(other->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar2];
  uVar3 = lVar1 << 4;
  if (lVar1 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __s_00 = (quad *)operator_new__(uVar3);
  memset(__s_00,0,uVar3);
  (this->quadratic_elements)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
       __s_00;
  uVar3 = (ulong)(n + 1) * 4;
  if (n < -1) {
    uVar3 = 0xffffffffffffffff;
  }
  __s_01 = (int *)operator_new__(uVar3);
  memset(__s_01,0,uVar3);
  (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s_01;
  if (n < 1) {
    __src = (other->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl;
    if (n < 0) goto LAB_0017e374;
  }
  else {
    memmove(__s,(other->linear_elements)._M_t.
                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                super__Head_base<0UL,_double_*,_false>._M_head_impl,(ulong)(uint)n << 3);
    __src = (other->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl;
  }
  memmove(__s_01,__src,(ulong)(n + 1) << 2);
LAB_0017e374:
  if (0 < (long)__src[lVar2]) {
    memmove(__s_00,(other->quadratic_elements)._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                   ._M_head_impl,(long)__src[lVar2] << 4);
    return;
  }
  return;
}

Assistant:

quadratic_cost_type(const quadratic_cost_type& other, int n)
      : obj(other.obj)
      , linear_elements(std::make_unique<Float[]>(n))
      , quadratic_elements(std::make_unique<quad[]>(other.indices[n]))
      , indices(std::make_unique<int[]>(n + 1))
    {
        std::copy_n(other.linear_elements.get(), n, linear_elements.get());
        std::copy_n(other.indices.get(), n + 1, indices.get());
        std::copy_n(other.quadratic_elements.get(),
                    other.indices[n],
                    quadratic_elements.get());
    }